

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyFileImpl::QNetworkReplyFileImpl
          (QNetworkReplyFileImpl *this,QNetworkAccessManager *manager,QNetworkRequest *req,
          Operation op)

{
  QLatin1StringView latin1;
  QAnyStringView newValue;
  QAnyStringView newValue_00;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  QFlags<QIODeviceBase::OpenModeFlag> QVar5;
  int iVar6;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar7;
  QNetworkReplyFileImplPrivate *pQVar8;
  QNetworkAccessManagerPrivate *pQVar9;
  QNetworkAccessManagerPrivate *__addr;
  QThread *pQVar10;
  ulong uVar11;
  QFile *this_00;
  QFile *str;
  QFile *pQVar12;
  QObject *in_RDX;
  QObject *in_RDI;
  long in_FS_OFFSET;
  bool opened;
  QNetworkFile *realFile;
  QNetworkReplyFileImplPrivate *d;
  QHttpHeaders h;
  QString msg_2;
  QString msg_1;
  QFileInfo fi;
  QString scheme;
  QString fileName;
  QString msg;
  QUrl url;
  undefined4 in_stack_fffffffffffffac8;
  undefined4 uVar13;
  Operation in_stack_fffffffffffffacc;
  undefined1 finished;
  QNetworkReplyFileImplPrivate *in_stack_fffffffffffffad0;
  QNetworkReplyPrivate *in_stack_fffffffffffffad8;
  NetworkError errorCode;
  QMetaMethodArgument *in_stack_fffffffffffffae0;
  QMetaMethodArgument *in_stack_fffffffffffffae8;
  ConnectionType CVar14;
  QObject *obj;
  QMetaMethodArgument *in_stack_fffffffffffffaf0;
  QObject *in_stack_fffffffffffffaf8;
  undefined2 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb02;
  undefined4 in_stack_fffffffffffffb04;
  ComponentFormattingOption f;
  QObject *in_stack_fffffffffffffb08;
  offset_in_QNetworkReply_to_subr *in_stack_fffffffffffffb10;
  ContextType *in_stack_fffffffffffffb18;
  QChar fillChar;
  Object *in_stack_fffffffffffffb20;
  undefined7 in_stack_fffffffffffffb40;
  ConnectionType CVar15;
  undefined1 local_400 [40];
  QDateTime local_3d8 [48];
  undefined8 local_3a8;
  undefined4 local_39c;
  undefined4 local_37c;
  undefined1 local_348 [24];
  char local_330 [24];
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined4 local_2fc;
  QChar local_2de;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_2dc;
  undefined1 local_2d8 [24];
  char local_2c0 [24];
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  Connection local_288;
  code *local_280;
  undefined8 local_278;
  Connection local_270;
  code *local_268;
  undefined8 local_260;
  QObject local_258 [12];
  int local_24c;
  undefined1 local_248 [32];
  undefined1 local_228 [30];
  undefined2 local_20a;
  QLatin1StringView local_1d0;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  undefined1 local_190 [32];
  undefined1 local_170 [31];
  undefined1 local_151;
  code *local_150;
  undefined8 local_148;
  undefined4 local_13c;
  QChar local_11e;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_11c;
  undefined1 local_118 [24];
  char local_100 [24];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 local_c0 [24];
  undefined1 local_a8 [24];
  QLatin1StringView local_90;
  undefined1 local_78 [24];
  QUrl local_60 [2];
  QUrl local_50;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  aVar7.m_data = operator_new(0x248);
  QNetworkReplyFileImplPrivate::QNetworkReplyFileImplPrivate(in_stack_fffffffffffffad0);
  QNetworkReply::QNetworkReply
            ((QNetworkReply *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
             (QObject *)in_stack_fffffffffffffad0);
  *(undefined ***)in_RDI = &PTR_metaObject_0049aef8;
  QNetworkReply::setRequest
            ((QNetworkReply *)in_stack_fffffffffffffad0,
             (QNetworkRequest *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  QNetworkRequest::url((QNetworkRequest *)in_stack_fffffffffffffad8);
  QNetworkReply::setUrl
            ((QNetworkReply *)in_stack_fffffffffffffad0,
             (QUrl *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
  QUrl::~QUrl(&local_50);
  QNetworkReply::setOperation((QNetworkReply *)in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_fffffffffffffad0,
             in_stack_fffffffffffffacc);
  QIODevice::open((QFlags_conflict *)in_RDI);
  pQVar8 = d_func((QNetworkReplyFileImpl *)0x1e6628);
  pQVar9 = QNetworkAccessManager::d_func((QNetworkAccessManager *)0x1e663d);
  pQVar8->managerPrivate = pQVar9;
  local_60[0].d = (QUrlPrivate *)0xaaaaaaaaaaaaaaaa;
  QNetworkRequest::url((QNetworkRequest *)in_stack_fffffffffffffad8);
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffad0,
             in_stack_fffffffffffffacc);
  QUrl::host((QFlags_conflict *)local_78);
  local_90 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0);
  bVar1 = ::operator==((QString *)in_stack_fffffffffffffad8,
                       (QLatin1StringView *)in_stack_fffffffffffffad0);
  QString::~QString((QString *)0x1e66e8);
  if ((bVar1 & 1) != 0) {
    QString::QString((QString *)0x1e66ff);
    QUrl::setHost((QString *)local_60,(ParsingMode)local_a8);
    QString::~QString((QString *)0x1e6726);
  }
  QFlags<QUrl::ComponentFormattingOption>::QFlags
            ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffad0,
             in_stack_fffffffffffffacc);
  QUrl::host((QFlags_conflict *)local_c0);
  bVar2 = QString::isEmpty((QString *)0x1e6761);
  QString::~QString((QString *)0x1e6774);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    QFlags<QUrl::ComponentFormattingOption>::QFlags
              ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffad0,
               in_stack_fffffffffffffacc);
    QUrl::path((QFlags_conflict *)local_170);
    bVar3 = QString::isEmpty((QString *)0x1e6955);
    QString::~QString((QString *)0x1e6966);
    if ((bVar3 & 1) != 0) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0);
      latin1.m_size._2_1_ = in_stack_fffffffffffffb02;
      latin1.m_size._0_2_ = in_stack_fffffffffffffb00;
      latin1.m_size._3_1_ = bVar3;
      latin1.m_size._4_4_ = in_stack_fffffffffffffb04;
      latin1.m_data = (char *)in_stack_fffffffffffffb08;
      QString::QString((QString *)in_stack_fffffffffffffae0,latin1);
      QUrl::setPath((QString *)local_60,(ParsingMode)local_190);
      QString::~QString((QString *)0x1e69d5);
    }
    QNetworkReply::setUrl
              ((QNetworkReply *)in_stack_fffffffffffffad0,
               (QUrl *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
    local_1a8 = 0xaaaaaaaaaaaaaaaa;
    local_1a0 = 0xaaaaaaaaaaaaaaaa;
    local_198 = 0xaaaaaaaaaaaaaaaa;
    QUrl::toLocalFile();
    bVar2 = QString::isEmpty((QString *)0x1e6a36);
    if (bVar2) {
      local_1c0 = 0xaaaaaaaaaaaaaaaa;
      local_1b8 = 0xaaaaaaaaaaaaaaaa;
      local_1b0 = 0xaaaaaaaaaaaaaaaa;
      QUrl::scheme();
      local_1d0 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0);
      bVar2 = ::operator==((QString *)in_stack_fffffffffffffad8,
                           (QLatin1StringView *)in_stack_fffffffffffffad0);
      if (bVar2) {
        local_20a = 0x3a;
        QFlags<QUrl::ComponentFormattingOption>::QFlags
                  ((QFlags<QUrl::ComponentFormattingOption> *)in_stack_fffffffffffffad0,
                   in_stack_fffffffffffffacc);
        QUrl::path((QFlags_conflict *)local_228);
        ::operator+((char16_t *)in_stack_fffffffffffffad8,(QString *)in_stack_fffffffffffffad0);
        ::QStringBuilder::operator_cast_to_QString
                  ((QStringBuilder<char16_t,_QString> *)
                   CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
        QString::operator=((QString *)in_stack_fffffffffffffad0,
                           (QString *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8))
        ;
        QString::~QString((QString *)0x1e6b4c);
        QStringBuilder<char16_t,_QString>::~QStringBuilder
                  ((QStringBuilder<char16_t,_QString> *)0x1e6b59);
        QString::~QString((QString *)0x1e6b66);
      }
      else {
        local_24c = (int)::operator|((UrlFormattingOption)((ulong)in_stack_fffffffffffffad0 >> 0x20)
                                     ,(UrlFormattingOption)in_stack_fffffffffffffad0);
        QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::operator|
                  ((QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> *)
                   in_stack_fffffffffffffad0,in_stack_fffffffffffffacc);
        QUrl::toString((QUrlTwoFlags_conflict1 *)local_248);
        QString::operator=((QString *)in_stack_fffffffffffffad0,
                           (QString *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8))
        ;
        QString::~QString((QString *)0x1e6bd5);
      }
      QString::~QString((QString *)0x1e6be2);
    }
    QVariant::QVariant((QVariant *)0x1e6bfc);
    QNetworkRequest::attribute
              ((QNetworkRequest *)in_stack_fffffffffffffad8,
               (Attribute)((ulong)in_stack_fffffffffffffae8 >> 0x20),
               (QVariant *)in_stack_fffffffffffffad0);
    bVar4 = QVariant::toBool();
    QVariant::~QVariant(&local_28);
    QVariant::~QVariant(&local_48);
    if ((bVar4 & 1) == 0) {
      QNetworkReply::setFinished
                ((QNetworkReply *)in_stack_fffffffffffffad0,
                 SUB41(in_stack_fffffffffffffacc >> 0x18,0));
      fillChar.ucs = (char16_t)((ulong)in_stack_fffffffffffffb18 >> 0x30);
      local_290 = 0xaaaaaaaaaaaaaaaa;
      QFileInfo::QFileInfo((QFileInfo *)&local_290,(QString *)&local_1a8);
      uVar11 = QFileInfo::isDir();
      if ((uVar11 & 1) == 0) {
        this_00 = (QFile *)operator_new(0x10);
        QFile::QFile(this_00,(QString *)&local_1a8,in_RDI);
        QPointer<QFile>::operator=
                  ((QPointer<QFile> *)this_00,
                   (QFile *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
        str = QPointer<QFile>::operator->((QPointer<QFile> *)0x1e7018);
        QVar5 = ::operator|((enum_type)((ulong)this_00 >> 0x20),(enum_type)this_00);
        bVar1 = (**(code **)(*(long *)str + 0x68))
                          (str,QVar5.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                               super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i);
        if ((bVar1 & 1) == 0) {
          local_318 = 0xaaaaaaaaaaaaaaaa;
          local_310 = 0xaaaaaaaaaaaaaaaa;
          local_308 = 0xaaaaaaaaaaaaaaaa;
          QCoreApplication::translate
                    (local_330,"QNetworkAccessFileBackend","Error opening %1: %2",0);
          pQVar12 = QPointer<QFile>::operator->((QPointer<QFile> *)0x1e70c2);
          (**(code **)(*(long *)pQVar12 + 0xe8))(local_348);
          QPointer<QFile>::operator->((QPointer<QFile> *)0x1e70ea);
          QIODevice::errorString();
          QString::arg<QString,QString>
                    ((QString *)in_RDX,(QString *)in_stack_fffffffffffffaf0,
                     (QString *)in_stack_fffffffffffffae8);
          QString::~QString((QString *)0x1e712c);
          QString::~QString((QString *)0x1e7139);
          QString::~QString((QString *)0x1e7146);
          uVar11 = QFileInfo::exists();
          errorCode = (NetworkError)((ulong)str >> 0x20);
          if ((uVar11 & 1) == 0) {
            QNetworkReply::setError
                      ((QNetworkReply *)in_stack_fffffffffffffae0,errorCode,(QString *)this_00);
            local_39c = 0xcb;
            QtPrivate::Invoke::argument<QNetworkReply::NetworkError>
                      ((char *)in_stack_fffffffffffffae0,(NetworkError *)str);
            CVar14 = (ConnectionType)((ulong)str >> 0x20);
            QMetaObject::invokeMethod<QMetaMethodArgument>
                      (in_RDX,(char *)in_stack_fffffffffffffaf0,
                       (ConnectionType)((ulong)in_stack_fffffffffffffae8 >> 0x20),
                       in_stack_fffffffffffffae0);
          }
          else {
            QNetworkReply::setError
                      ((QNetworkReply *)in_stack_fffffffffffffae0,errorCode,(QString *)this_00);
            local_37c = 0xc9;
            QtPrivate::Invoke::argument<QNetworkReply::NetworkError>
                      ((char *)in_stack_fffffffffffffae0,(NetworkError *)str);
            CVar14 = (ConnectionType)((ulong)str >> 0x20);
            QMetaObject::invokeMethod<QMetaMethodArgument>
                      (in_RDX,(char *)in_stack_fffffffffffffaf0,
                       (ConnectionType)((ulong)in_stack_fffffffffffffae8 >> 0x20),
                       in_stack_fffffffffffffae0);
          }
          QMetaObject::invokeMethod<>
                    ((QObject *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,CVar14);
          QString::~QString((QString *)0x1e7241);
        }
        else {
          local_3a8 = 0xaaaaaaaaaaaaaaaa;
          QNetworkReply::headers((QNetworkReply *)str);
          CVar15 = (ConnectionType)((ulong)in_RDX >> 0x20);
          QFileInfo::lastModified
                    ((QFileInfo *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
          QNetworkHeadersPrivate::toHttpDate
                    ((QDateTime *)
                     CONCAT44(in_stack_fffffffffffffb04,
                              CONCAT13(bVar3,CONCAT12(bVar4,in_stack_fffffffffffffb00))));
          QAnyStringView::QAnyStringView
                    ((QAnyStringView *)in_stack_fffffffffffffae0,(QByteArray *)str);
          newValue.m_size = (size_t)in_RDI;
          newValue.field_0.m_data = aVar7.m_data;
          QHttpHeaders::replaceOrAppend
                    ((QHttpHeaders *)str,(WellKnownHeader)((ulong)this_00 >> 0x20),newValue);
          QByteArray::~QByteArray((QByteArray *)0x1e72d5);
          QDateTime::~QDateTime(local_3d8);
          iVar6 = QFileInfo::size();
          QByteArray::number((longlong)local_400,iVar6);
          QAnyStringView::QAnyStringView
                    ((QAnyStringView *)in_stack_fffffffffffffae0,(QByteArray *)str);
          newValue_00.m_size = (size_t)in_RDI;
          newValue_00.field_0.m_data = aVar7.m_data;
          QHttpHeaders::replaceOrAppend
                    ((QHttpHeaders *)str,(WellKnownHeader)((ulong)this_00 >> 0x20),newValue_00);
          QByteArray::~QByteArray((QByteArray *)0x1e7348);
          QNetworkReply::setHeaders
                    ((QNetworkReply *)this_00,
                     (QHttpHeaders *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
          QMetaObject::invokeMethod<>
                    ((QObject *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,
                     (ConnectionType)((ulong)str >> 0x20));
          QFileInfo::size();
          QtPrivate::Invoke::argument<long_long>((char *)in_stack_fffffffffffffae0,(longlong *)str);
          QFileInfo::size();
          QtPrivate::Invoke::argument<long_long>((char *)in_stack_fffffffffffffae0,(longlong *)str);
          CVar14 = (ConnectionType)((ulong)str >> 0x20);
          QMetaObject::invokeMethod<QMetaMethodArgument,QMetaMethodArgument>
                    (in_stack_fffffffffffffb08,
                     (char *)CONCAT44(in_stack_fffffffffffffb04,
                                      CONCAT13(bVar3,CONCAT12(bVar4,in_stack_fffffffffffffb00))),
                     CVar15,in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8);
          QMetaObject::invokeMethod<>
                    ((QObject *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,CVar14);
          QMetaObject::invokeMethod<>
                    ((QObject *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,CVar14);
          QHttpHeaders::~QHttpHeaders((QHttpHeaders *)0x1e7431);
        }
      }
      else {
        local_2a8 = 0xaaaaaaaaaaaaaaaa;
        local_2a0 = 0xaaaaaaaaaaaaaaaa;
        local_298 = 0xaaaaaaaaaaaaaaaa;
        QCoreApplication::translate
                  (local_2c0,"QNetworkAccessFileBackend","Cannot open %1: Path is a directory",0);
        QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                  (&local_2dc,PrettyDecoded);
        QUrl::toString((QUrlTwoFlags_conflict1 *)local_2d8);
        QChar::QChar<char16_t,_true>(&local_2de,L' ');
        QString::arg<QString,_true>
                  ((QString *)in_stack_fffffffffffffaf0,(QString *)in_stack_fffffffffffffae8,
                   (int)((ulong)in_stack_fffffffffffffae0 >> 0x20),fillChar);
        QString::~QString((QString *)0x1e6f2b);
        QString::~QString((QString *)0x1e6f38);
        QNetworkReply::setError
                  ((QNetworkReply *)in_stack_fffffffffffffae0,
                   (NetworkError)((ulong)in_stack_fffffffffffffad8 >> 0x20),
                   (QString *)in_stack_fffffffffffffad0);
        local_2fc = 0xca;
        QtPrivate::Invoke::argument<QNetworkReply::NetworkError>
                  ((char *)in_stack_fffffffffffffae0,(NetworkError *)in_stack_fffffffffffffad8);
        CVar14 = (ConnectionType)((ulong)in_stack_fffffffffffffad8 >> 0x20);
        QMetaObject::invokeMethod<QMetaMethodArgument>
                  (in_RDX,(char *)in_stack_fffffffffffffaf0,
                   (ConnectionType)((ulong)in_stack_fffffffffffffae8 >> 0x20),
                   in_stack_fffffffffffffae0);
        QMetaObject::invokeMethod<>
                  ((QObject *)in_stack_fffffffffffffae8,(char *)in_stack_fffffffffffffae0,CVar14);
        QString::~QString((QString *)0x1e6fc2);
      }
      QFileInfo::~QFileInfo((QFileInfo *)&local_290);
    }
    else {
      __addr = (QNetworkAccessManagerPrivate *)operator_new(0x10);
      CVar14 = (ConnectionType)((ulong)in_stack_fffffffffffffad8 >> 0x20);
      iVar6 = (int)in_RDI;
      QNetworkFile::QNetworkFile
                ((QNetworkFile *)in_stack_fffffffffffffad0,
                 (QString *)CONCAT44(in_stack_fffffffffffffacc,in_stack_fffffffffffffac8));
      local_268 = QNetworkReply::setWellKnownHeader;
      local_260 = 0;
      CVar15 = 0x1c4770;
      obj = local_258;
      pQVar9 = __addr;
      QObject::
      connect<void(QNetworkFile::*)(QHttpHeaders::WellKnownHeader,QByteArray_const&),void(QNetworkReply::*)(QHttpHeaders::WellKnownHeader,QByteArrayView)>
                (in_stack_fffffffffffffb20,CONCAT17(bVar1,in_stack_fffffffffffffb40),
                 in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,0x1c4770);
      QMetaObject::Connection::~Connection((Connection *)obj);
      local_280 = QNetworkReply::setError;
      local_278 = 0;
      uVar13 = 2;
      QObject::
      connect<void(QNetworkFile::*)(QNetworkReply::NetworkError,QString_const&),void(QNetworkReply::*)(QNetworkReply::NetworkError,QString_const&)>
                (in_stack_fffffffffffffb20,CONCAT17(bVar1,in_stack_fffffffffffffb40),
                 in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,CVar15);
      QMetaObject::Connection::~Connection(&local_270);
      QObject::connect((QObject *)&local_288,iVar6,(sockaddr *)__addr,0x3c3e84);
      QMetaObject::Connection::~Connection(&local_288);
      pQVar10 = QNetworkAccessManagerPrivate::createThread(pQVar9);
      QObject::moveToThread(__addr,pQVar10);
      QMetaObject::invokeMethod<>(obj,(char *)pQVar9,CVar14);
      QPointer<QFile>::operator=
                ((QPointer<QFile> *)in_stack_fffffffffffffad0,
                 (QFile *)CONCAT44(in_stack_fffffffffffffacc,uVar13));
    }
    QString::~QString((QString *)0x1e7470);
  }
  else {
    local_e8 = 0xaaaaaaaaaaaaaaaa;
    uStack_e0 = 0xaaaaaaaaaaaaaaaa;
    local_d8 = 0xaaaaaaaaaaaaaaaa;
    f = PrettyDecoded;
    QCoreApplication::translate
              (local_100,"QNetworkAccessFileBackend","Request for opening non-local file %1",0);
    finished = (undefined1)(in_stack_fffffffffffffacc >> 0x18);
    QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
              (&local_11c,f);
    QUrl::toString((QUrlTwoFlags_conflict1 *)local_118);
    QChar::QChar<char16_t,_true>(&local_11e,L' ');
    QString::arg<QString,_true>
              ((QString *)in_stack_fffffffffffffaf0,(QString *)in_stack_fffffffffffffae8,
               (int)((ulong)in_stack_fffffffffffffae0 >> 0x20),
               (QChar)(char16_t)((ulong)&local_e8 >> 0x30));
    CVar14 = (ConnectionType)((ulong)in_stack_fffffffffffffae8 >> 0x20);
    QString::~QString((QString *)0x1e6847);
    QString::~QString((QString *)0x1e6851);
    QNetworkReply::setError
              ((QNetworkReply *)in_stack_fffffffffffffae0,
               (NetworkError)((ulong)in_stack_fffffffffffffad8 >> 0x20),
               (QString *)in_stack_fffffffffffffad0);
    QNetworkReply::setFinished((QNetworkReply *)in_stack_fffffffffffffad0,(bool)finished);
    local_13c = 0x12e;
    QtPrivate::Invoke::argument<QNetworkReply::NetworkError>
              ((char *)in_stack_fffffffffffffae0,(NetworkError *)in_stack_fffffffffffffad8);
    QMetaObject::invokeMethod<QMetaMethodArgument>
              (in_stack_fffffffffffffaf8,(char *)in_stack_fffffffffffffaf0,CVar14,
               in_stack_fffffffffffffae0);
    local_150 = fileOpenFinished;
    local_148 = 0;
    local_151 = 0;
    QMetaObject::invokeMethod<void(QNetworkReplyFileImpl::*)(bool),bool>
              ((ContextType *)in_stack_fffffffffffffaf8,
               (offset_in_QNetworkReplyFileImpl_to_subr *)in_stack_fffffffffffffaf0,CVar14,
               (bool *)in_stack_fffffffffffffae0);
    QString::~QString((QString *)0x1e6915);
  }
  QUrl::~QUrl(local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QNetworkReplyFileImpl::QNetworkReplyFileImpl(QNetworkAccessManager *manager, const QNetworkRequest &req, const QNetworkAccessManager::Operation op)
    : QNetworkReply(*new QNetworkReplyFileImplPrivate(), manager)
{
    setRequest(req);
    setUrl(req.url());
    setOperation(op);
    QNetworkReply::open(QIODevice::ReadOnly);

    QNetworkReplyFileImplPrivate *d = (QNetworkReplyFileImplPrivate*) d_func();

    d->managerPrivate = manager->d_func();

    QUrl url = req.url();
    if (url.host() == "localhost"_L1)
        url.setHost(QString());

#if !defined(Q_OS_WIN)
    // do not allow UNC paths on Unix
    if (!url.host().isEmpty()) {
        // we handle only local files
        QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Request for opening non-local file %1").arg(url.toString());
        setError(QNetworkReply::ProtocolInvalidOperationError, msg);
        setFinished(true); // We're finished, will emit finished() after ctor is done.
        QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
            Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ProtocolInvalidOperationError));
        QMetaObject::invokeMethod(this, &QNetworkReplyFileImpl::fileOpenFinished, Qt::QueuedConnection, false);
        return;
    }
#endif
    if (url.path().isEmpty())
        url.setPath("/"_L1);
    setUrl(url);

    QString fileName = url.toLocalFile();
    if (fileName.isEmpty()) {
        const QString scheme = url.scheme();
        if (scheme == "qrc"_L1) {
            fileName = u':' + url.path();
        } else {
#if defined(Q_OS_ANDROID)
            if (scheme == "assets"_L1)
                fileName = "assets:"_L1 + url.path();
            else
#endif
                fileName = url.toString(QUrl::RemoveAuthority | QUrl::RemoveFragment | QUrl::RemoveQuery);
        }
    }

    if (req.attribute(QNetworkRequest::BackgroundRequestAttribute).toBool()) { // Asynchronous open
        auto realFile = new QNetworkFile(fileName);
        connect(realFile, &QNetworkFile::headerRead, this, &QNetworkReplyFileImpl::setWellKnownHeader,
                Qt::QueuedConnection);
        connect(realFile, &QNetworkFile::networkError, this, &QNetworkReplyFileImpl::setError,
                Qt::QueuedConnection);
        connect(realFile, SIGNAL(finished(bool)), SLOT(fileOpenFinished(bool)),
                Qt::QueuedConnection);

        realFile->moveToThread(d->managerPrivate->createThread());
        QMetaObject::invokeMethod(realFile, "open", Qt::QueuedConnection);

        d->realFile = realFile;
    } else { // Synch open
        setFinished(true);

        QFileInfo fi(fileName);
        if (fi.isDir()) {
            QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Cannot open %1: Path is a directory").arg(url.toString());
            setError(QNetworkReply::ContentOperationNotPermittedError, msg);
            QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ContentOperationNotPermittedError));
            QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
            return;
        }
        d->realFile = new QFile(fileName, this);
        bool opened = d->realFile->open(QIODevice::ReadOnly | QIODevice::Unbuffered);

        // could we open the file?
        if (!opened) {
            QString msg = QCoreApplication::translate("QNetworkAccessFileBackend", "Error opening %1: %2")
                    .arg(d->realFile->fileName(), d->realFile->errorString());

            if (fi.exists()) {
                setError(QNetworkReply::ContentAccessDenied, msg);
                QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                    Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ContentAccessDenied));
            } else {
                setError(QNetworkReply::ContentNotFoundError, msg);
                QMetaObject::invokeMethod(this, "errorOccurred", Qt::QueuedConnection,
                    Q_ARG(QNetworkReply::NetworkError, QNetworkReply::ContentNotFoundError));
            }
            QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
            return;
        }
        auto h = headers();
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::LastModified,
                          QNetworkHeadersPrivate::toHttpDate(fi.lastModified()));
        h.replaceOrAppend(QHttpHeaders::WellKnownHeader::ContentLength,
                          QByteArray::number(fi.size()));
        setHeaders(std::move(h));

        QMetaObject::invokeMethod(this, "metaDataChanged", Qt::QueuedConnection);
        QMetaObject::invokeMethod(this, "downloadProgress", Qt::QueuedConnection,
            Q_ARG(qint64, fi.size()), Q_ARG(qint64, fi.size()));
        QMetaObject::invokeMethod(this, "readyRead", Qt::QueuedConnection);
        QMetaObject::invokeMethod(this, "finished", Qt::QueuedConnection);
    }
}